

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O0

void __thiscall gui::RadioButton::uncheckRadioButtons(RadioButton *this)

{
  bool bVar1;
  Container *pCVar2;
  __shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2> *this_00;
  Widget *in_RDI;
  RadioButton *childButton;
  shared_ptr<gui::Widget> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *__range1;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
  *in_stack_ffffffffffffffb8;
  element_type *in_stack_ffffffffffffffc0;
  __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
  local_18;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *local_10;
  
  pCVar2 = Widget::getParent(in_RDI);
  if (pCVar2 != (Container *)0x0) {
    pCVar2 = Widget::getParent(in_RDI);
    local_10 = ContainerBase::getChildren(&pCVar2->super_ContainerBase);
    local_18._M_current =
         (shared_ptr<gui::Widget> *)
         std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::
         begin(in_stack_ffffffffffffffb8);
    std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::end
              (in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffffc0,
                              (__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffffb8), bVar1) {
      this_00 = &__gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                 ::operator*(&local_18)->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>
      ;
      in_stack_ffffffffffffffc0 =
           std::__shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
      if (in_stack_ffffffffffffffc0 == (element_type *)0x0) {
        in_stack_ffffffffffffffb8 =
             (vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *
             )0x0;
      }
      else {
        in_stack_ffffffffffffffb8 =
             (vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *
             )__dynamic_cast(in_stack_ffffffffffffffc0,&Widget::typeinfo,&typeinfo,0);
      }
      if ((in_stack_ffffffffffffffb8 !=
           (vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *)
           0x0) && (((ulong)in_stack_ffffffffffffffb8[0x1e].
                            super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x100) != 0)) {
        *(undefined1 *)
         ((long)&in_stack_ffffffffffffffb8[0x1e].
                 super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        Widget::requestRedraw(in_stack_ffffffffffffffc0);
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void RadioButton::uncheckRadioButtons() {
    if (getParent() == nullptr) {
        return;
    }
    for (const auto& child : getParent()->getChildren()) {
        auto childButton = dynamic_cast<RadioButton*>(child.get());
        if (childButton != nullptr && childButton->isChecked_) {
            childButton->isChecked_ = false;
            requestRedraw();
        }
    }
}